

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmintcls.h
# Opt level: O2

vm_obj_id_t __thiscall
CVmObjClass::find_intcls_for_mod(CVmObjClass *this,vm_obj_id_t self,vm_obj_id_t mod_obj)

{
  uint uVar1;
  int iVar2;
  
  while( true ) {
    uVar1 = *(uint *)(*(long *)((long)&((CVmObjPageEntry *)this)->ptr_ + 8) + 4);
    if (uVar1 != 0) {
      if (uVar1 == mod_obj) {
        return self;
      }
      iVar2 = (**(code **)(*(long *)&G_obj_table_X.pages_[uVar1 >> 0xc][uVar1 & 0xfff].ptr_ + 0x38))
                        (G_obj_table_X.pages_[uVar1 >> 0xc] + (uVar1 & 0xfff),mod_obj);
      if (iVar2 != 0) {
        return self;
      }
    }
    iVar2 = (**(code **)(*(long *)&((CVmObjPageEntry *)this)->ptr_ + 0x40))(this,self);
    if (iVar2 == 0) {
      return 0;
    }
    self = (**(code **)(*(long *)&((CVmObjPageEntry *)this)->ptr_ + 0x48))(this,self,0);
    if (self == 0) break;
    this = (CVmObjClass *)(G_obj_table_X.pages_[self >> 0xc] + (self & 0xfff));
  }
  return 0;
}

Assistant:

vm_obj_id_t find_intcls_for_mod(VMG_ vm_obj_id_t self,
                                    vm_obj_id_t mod_obj)
    {
        /*
         *   The implementation is very simple: just look for a modifier
         *   object attached to this object or one of its intrinsic
         *   superclasses.  The difference between this and the regular
         *   CVmObject implementation is that the CVmObject implementation
         *   looks in the object's metaclass; we simply look in our intrinsic
         *   superclasses directly, since, for reflection purposes, we are
         *   our own metaclass.  
         */
        return find_mod_src_obj(vmg_ self, mod_obj);
    }